

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleTree::cellAt(QAccessibleTree *this,int row,int column)

{
  QTreeViewPrivate *this_00;
  QHeaderView *pQVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QAccessibleInterface *pQVar5;
  long in_FS_OFFSET;
  char local_68 [24];
  char *local_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  indexFromLogical((QModelIndex *)&local_48,this,row,column);
  if ((((int)local_48 < 0) || ((long)local_48 < 0)) || (local_38.ptr == (QAbstractItemModel *)0x0))
  {
    local_68[0] = '\x02';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_50 = "default";
    pQVar5 = (QAccessibleInterface *)0x0;
    QMessageLogger::warning
              (local_68,"Requested invalid tree cell: %d %d",(ulong)(uint)row,(ulong)(uint)column);
  }
  else {
    (**(code **)(*(long *)&(this->super_QAccessibleTable).super_QAccessibleObject + 0x18))
              (&(this->super_QAccessibleTable).super_QAccessibleObject);
    QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    lVar4 = QMetaObject::cast((QObject *)&QTreeView::staticMetaObject);
    this_00 = *(QTreeViewPrivate **)(lVar4 + 8);
    iVar2 = QTreeViewPrivate::viewIndex(this_00,(QModelIndex *)&local_48);
    pQVar1 = this_00->header;
    local_68[0] = -1;
    local_68[1] = -1;
    local_68[2] = -1;
    local_68[3] = -1;
    local_68[4] = -1;
    local_68[5] = -1;
    local_68[6] = -1;
    local_68[7] = -1;
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    iVar3 = (**(code **)(*(long *)(this_00->super_QAbstractItemViewPrivate).model + 0x80))();
    pQVar5 = (QAccessibleInterface *)
             (**(code **)(*(long *)&this->super_QAccessibleTable + 0x100))
                       (this,((iVar2 + 1) - (uint)(pQVar1 == (QHeaderView *)0x0)) * iVar3 +
                             local_48._4_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTree::cellAt(int row, int column) const
{
    QModelIndex index = indexFromLogical(row, column);
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning("Requested invalid tree cell: %d %d", row, column);
        return nullptr;
    }
    const QTreeView *treeView = qobject_cast<const QTreeView*>(view());
    Q_ASSERT(treeView);
    int logicalIndex = treeView->d_func()->accessibleTable2Index(index);

    return child(logicalIndex);
}